

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::WriteBins(BamStandardIndex *this,int *refId,BaiBinMap *bins)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var3;
  BamException *this_00;
  int32_t binCount;
  uint local_6c;
  string local_68;
  string local_48;
  
  local_6c = (uint)(bins->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (this->m_isBigEndian == true) {
    local_6c = local_6c << 0x18 | (int)local_6c >> 0x18 | (local_6c & 0xff00) << 8 |
               local_6c >> 8 & 0xff00;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_6c,4);
  if (CONCAT44(extraout_var,iVar2) != 4) {
    this_00 = (BamException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"BamStandardIndex::WriteBins","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"could not write bin count","");
    BamException::BamException(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
  }
  local_68._M_dataplus._M_p._0_4_ = (int)(bins->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  SaveBinsSummary(this,refId,(int *)&local_68);
  for (p_Var3 = (bins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(bins->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    WriteBin(this,&p_Var3[1]._M_color,(BaiAlignmentChunkVector *)&p_Var3[1]._M_parent);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteBins(const int& refId, BaiBinMap& bins)
{

    // write number of bins
    int32_t binCount = bins.size();
    if (m_isBigEndian) SwapEndian_32(binCount);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&binCount, sizeof(binCount));
    if (numBytesWritten != sizeof(binCount))
        throw BamException("BamStandardIndex::WriteBins", "could not write bin count");

    // save summary for reference's bins
    SaveBinsSummary(refId, bins.size());

    // iterate over bins
    BaiBinMap::iterator binIter = bins.begin();
    BaiBinMap::iterator binEnd = bins.end();
    for (; binIter != binEnd; ++binIter)
        WriteBin((*binIter).first, (*binIter).second);
}